

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field,bool is_setter_argument,bool force_present,
          bool singular_if_not_packed,BytesMode bytes_mode)

{
  bool bVar1;
  bool bVar2;
  Type TVar3;
  CppType CVar4;
  LogMessage *other;
  char *pcVar5;
  undefined3 in_register_00000081;
  BytesMode bytes_mode_00;
  undefined3 in_stack_00000009;
  LogMessage local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bytes_mode_00 = CONCAT31(in_register_00000081,is_setter_argument);
  if (((byte)field & is_setter_argument) == 1) {
    internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0x3db);
    other = internal::LogMessage::operator<<
                      (&local_88,"CHECK failed: !(is_setter_argument && force_present): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_50,other);
    internal::LogMessage::~LogMessage(&local_88);
  }
  JSTypeName_abi_cxx11_
            (__return_storage_ptr__,this,options,(FieldDescriptor *)(ulong)_singular_if_not_packed,
             bytes_mode_00);
  if ((*(int *)&options->field_0x4c == 3) &&
     (bVar1 = FieldDescriptor::is_packed((FieldDescriptor *)options), bVar1 || !force_present)) {
    TVar3 = FieldDescriptor::type((FieldDescriptor *)options);
    if (_singular_if_not_packed == 0 && TVar3 == TYPE_BYTES) {
      pcVar5 = "(Array<!Uint8Array>|Array<string>)";
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      this = (_anonymous_namespace_ *)pcVar5;
    }
    else {
      bVar1 = anon_unknown_0::IsPrimitive(__return_storage_ptr__);
      if (!bVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_88,"!",__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
      std::operator+(&local_50,"Array.<",__return_storage_ptr__);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                     &local_50,">");
      this = (_anonymous_namespace_ *)&local_88;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((byte)field == 0) {
    if ((((!is_setter_argument) && (*(int *)&options->field_0x4c != 2)) &&
        (TVar3 = FieldDescriptor::type((FieldDescriptor *)options), TVar3 != TYPE_ENUM)) &&
       (((*(int *)((options->namespace_prefix).field_2._M_allocated_capacity + 0x8c) != 3 ||
         (CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)options), CVar4 == CPPTYPE_MESSAGE))
        && (bVar1 = anon_unknown_0::ReturnsNullWhenUnset(options,(FieldDescriptor *)this), bVar1))))
    {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                     "?",__return_storage_ptr__);
      goto LAB_00258083;
    }
  }
  else {
    bVar1 = anon_unknown_0::ReturnsNullWhenUnset(options,(FieldDescriptor *)this);
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                     "?",__return_storage_ptr__);
      this = (_anonymous_namespace_ *)&local_88;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    bVar2 = anon_unknown_0::ReturnsNullWhenUnset(options,(FieldDescriptor *)this);
    if (bVar2) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  bVar1 = anon_unknown_0::IsPrimitive(__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,"!",
                 __return_storage_ptr__);
LAB_00258083:
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

string JSFieldTypeAnnotation(const GeneratorOptions& options,
                             const FieldDescriptor* field,
                             bool is_setter_argument,
                             bool force_present,
                             bool singular_if_not_packed,
                             BytesMode bytes_mode = BYTES_DEFAULT) {
  GOOGLE_CHECK(!(is_setter_argument && force_present));
  string jstype = JSTypeName(options, field, bytes_mode);

  if (field->is_repeated() &&
      (field->is_packed() || !singular_if_not_packed)) {
    if (field->type() == FieldDescriptor::TYPE_BYTES &&
        bytes_mode == BYTES_DEFAULT) {
      jstype = "(Array<!Uint8Array>|Array<string>)";
    } else {
      if (!IsPrimitive(jstype)) {
        jstype = "!" + jstype;
      }
      jstype = "Array.<" + jstype + ">";
    }
  }

  bool is_null_or_undefined = false;

  if (is_setter_argument) {
    if (SetterAcceptsNull(options, field)) {
      jstype = "?" + jstype;
      is_null_or_undefined = true;
    }

    if (SetterAcceptsUndefined(options, field)) {
      jstype += "|undefined";
      is_null_or_undefined = true;
    }
  } else if (force_present) {
    // Don't add null or undefined.
  } else {
    if (DeclaredReturnTypeIsNullable(options, field)) {
      jstype = "?" + jstype;
      is_null_or_undefined = true;
    }
  }

  if (!is_null_or_undefined && !IsPrimitive(jstype)) {
    jstype = "!" + jstype;
  }

  return jstype;
}